

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void PatternMatch_Expression(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  int endIdx;
  kNode *node;
  kNameSpace *ns;
  kNode *o;
  int returnIdx;
  uintptr_t local_40;
  kArray *local_38;
  
  node = sfp[1].field_0.asNode;
  local_40 = sfp[2].field_1.unboxValue;
  local_38 = sfp[3].field_0.asArray;
  iVar1 = *(int *)&sfp[4].field_1;
  endIdx = *(int *)&sfp[6].field_1;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_Expression",0x1b,"tracing..");
  returnIdx = iVar1;
  ns = kNode_GetNameSpace(kctx,node);
  o = ParseNewNode(kctx,ns,local_38,&returnIdx,endIdx,OnlyPatternMatch,(char *)0x0);
  if (o != *(kNode **)((*kctx->runtimeModels)[1].freeModel + 0xc0)) {
    kNode_AddParsedObject(kctx,node,(ksymbol_t)local_40,(kObject_conflict *)o);
  }
  sfp[-4].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)(long)returnIdx;
  return;
}

Assistant:

static KMETHOD PatternMatch_Expression(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = beginIdx;
	kNode *expr = ParseNewNode(kctx, kNode_ns(stmt), tokenList, &returnIdx, endIdx, (ParseOption)(ParseExpressionOption|OnlyPatternMatch), NULL);
	if(expr != K_NULLNODE) {
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(expr));
	}
	KReturnUnboxValue(returnIdx);
}